

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall
basisu::basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  vector<basisu::vector<unsigned_int>_> *this_00;
  uint *in_RDI;
  vector<unsigned_int> *unaff_retaddr;
  uint *last;
  uint_vec *cluster_indices;
  uint32_t i;
  uint32_t parent_cluster_index;
  uint32_t cluster_index;
  uint32_t block_index;
  uint *in_stack_ffffffffffffffa8;
  vector<basisu::vector<unsigned_int>_> *in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar3;
  basisu_frontend *in_stack_ffffffffffffffe0;
  uint local_18;
  uint32_t in_stack_fffffffffffffff0;
  uint uVar4;
  uint *pFirst;
  
  pFirst = in_RDI;
  generate_block_endpoint_clusters(in_stack_ffffffffffffffe0);
  vector<basisu::vector<unsigned_int>_>::resize
            ((vector<basisu::vector<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (size_t)in_stack_ffffffffffffffb8,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
  vector<basisu::vector<unsigned_int>_>::size
            ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x34));
  vector<basisu::vector<unsigned_int>_>::resize
            ((vector<basisu::vector<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (size_t)in_stack_ffffffffffffffb8,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
  for (uVar4 = 0; uVar4 < in_RDI[0x10]; uVar4 = uVar4 + 1) {
    vector<basisu::vec2U>::operator[]
              ((vector<basisu::vec2U> *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8)
    ;
    puVar2 = vec2U::operator[]((vec2U *)in_stack_ffffffffffffffb0,
                               (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    in_stack_fffffffffffffff0 = *puVar2;
    vector<unsigned_char>::operator[]
              ((vector<unsigned_char> *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8)
    ;
    vector<basisu::vector<unsigned_int>_>::operator[]
              (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
               ,in_stack_ffffffffffffffb8);
  }
  local_18 = 0;
  while( true ) {
    uVar3 = local_18;
    uVar1 = vector<basisu::vector<unsigned_int>_>::size
                      ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x3c));
    if (uVar1 <= uVar3) break;
    this_00 = (vector<basisu::vector<unsigned_int>_> *)
              vector<basisu::vector<unsigned_int>_>::operator[]
                        (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00);
    if (uVar1 == 0) {
      handle_verify_failure(0);
    }
    vector_sort<basisu::vector<unsigned_int>>((vector<unsigned_int> *)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffa8 = vector<unsigned_int>::begin((vector<unsigned_int> *)this_00);
    vector<unsigned_int>::end((vector<unsigned_int> *)this_00);
    in_stack_ffffffffffffffb0 = this_00;
    in_stack_ffffffffffffffb8 =
         std::unique<unsigned_int*>
                   ((uint *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    vector<unsigned_int>::end((vector<unsigned_int> *)in_stack_ffffffffffffffb0);
    vector<unsigned_int>::erase
              (unaff_retaddr,pFirst,(uint *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster()
	{
		generate_block_endpoint_clusters();

		m_endpoint_clusters_within_each_parent_cluster.resize(0);
		m_endpoint_clusters_within_each_parent_cluster.resize(m_endpoint_parent_clusters.size());

		// Note: It's possible that some blocks got moved into the same cluster, but live in different parent clusters.
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t parent_cluster_index = m_block_parent_endpoint_cluster[block_index];

			m_endpoint_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_endpoint_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_endpoint_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}